

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O1

void dlep_writer_add_ipv4_conpoint_tlv(dlep_writer *writer,netaddr *addr,uint16_t port,_Bool tls)

{
  uint8_t value [7];
  undefined1 local_1f;
  undefined1 local_1e [4];
  ushort local_1a;
  
  if (addr->_type == '\x02') {
    local_1f = tls;
    netaddr_to_binary(local_1e,addr,7);
    local_1a = port << 8 | port >> 8;
    dlep_writer_add_tlv(writer,2,&local_1f,7);
  }
  return;
}

Assistant:

void
dlep_writer_add_ipv4_conpoint_tlv(struct dlep_writer *writer, const struct netaddr *addr, uint16_t port, bool tls) {
  uint8_t value[7];

  if (netaddr_get_address_family(addr) != AF_INET) {
    return;
  }

  /* convert port to network byte order */
  port = htons(port);

  /* copy data into value buffer */
  value[0] = tls ? DLEP_CONNECTION_TLS : DLEP_CONNECTION_PLAIN;
  netaddr_to_binary(&value[1], addr, sizeof(value));
  memcpy(&value[5], &port, sizeof(port));

  dlep_writer_add_tlv(writer, DLEP_IPV4_CONPOINT_TLV, &value, sizeof(value));
}